

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  uint32_t uVar1;
  Dim DVar2;
  undefined8 type;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  SPIRType *pSVar6;
  char *pcVar7;
  CompilerError *this_00;
  string *in_R8;
  char *pcVar8;
  undefined1 local_1d8 [48];
  SPIRType expected_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  
  uVar1 = (args->base).img.id;
  local_1d8._32_8_ = (args->base).imgtype;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((args->base).is_fetch == true) {
    convert_separate_image_to_expression_abi_cxx11_((string *)&expected_type,this,uVar1);
  }
  else {
    to_expression_abi_cxx11_((string *)&expected_type,this,uVar1,true);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&expected_type);
  ::std::__cxx11::string::~string((string *)&expected_type);
  bVar5 = (this->backend).swizzle_is_function;
  local_1d8._44_4_ = uVar1;
  bVar3 = should_forward(this,args->coord);
  uVar1 = args->coord_components;
  pSVar6 = Compiler::expression_type(&this->super_Compiler,args->coord);
  type = local_1d8._32_8_;
  pcVar8 = "";
  if (uVar1 != pSVar6->vecsize) {
    if (uVar1 == 1) {
      pcVar8 = ".x";
    }
    else {
      if (uVar1 == 3) {
        pcVar7 = ".xyz()";
        pcVar8 = ".xyz";
      }
      else {
        if (uVar1 != 2) goto LAB_0021c7dc;
        pcVar7 = ".xy()";
        pcVar8 = ".xy";
      }
      if (bVar5 != false) {
        pcVar8 = pcVar7;
      }
    }
  }
LAB_0021c7dc:
  if (*pcVar8 == '\0') {
    to_expression_abi_cxx11_(&coord_expr,this,args->coord,true);
  }
  else {
    to_enclosed_expression_abi_cxx11_((string *)&expected_type,this,args->coord,true);
    ::std::operator+(&coord_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &expected_type,pcVar8);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  pSVar6 = Compiler::expression_type(&this->super_Compiler,args->coord);
  if (*(int *)&(pSVar6->super_IVariant).field_0xc == 8) {
    SPIRType::SPIRType(&expected_type,pSVar6);
    expected_type.vecsize = args->coord_components;
    expected_type.super_IVariant._12_4_ = 7;
    in_R8 = &coord_expr;
    bitcast_expression((string *)local_1d8,this,&expected_type,
                       *(BaseType *)&(pSVar6->super_IVariant).field_0xc,in_R8);
    ::std::__cxx11::string::operator=((string *)&coord_expr,(string *)local_1d8);
    ::std::__cxx11::string::~string((string *)local_1d8);
    SPIRType::~SPIRType(&expected_type);
  }
  DVar2 = ((ImageType *)(type + 0xf8))->dim;
  if (((byte)(DVar2 == DimCube | DVar2 == Dim2D & ((ImageType *)(type + 0xf8))->arrayed) == 1) &&
     (bVar4 = Compiler::image_is_comparison(&this->super_Compiler,(SPIRType *)type,local_1d8._44_4_)
     , bVar4)) {
    bVar4 = args->lod != 0;
  }
  else {
    bVar4 = false;
  }
  if (args->dref == 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    if (bVar3) {
      bVar3 = should_forward(this,args->dref);
    }
    else {
      bVar3 = false;
    }
    if (((args->base).is_gather == false) && (args->coord_components != 4)) {
      if ((args->base).is_proj != true) {
        pSVar6 = Compiler::expression_type(&this->super_Compiler,args->coord);
        SPIRType::SPIRType(&expected_type,pSVar6);
        expected_type.vecsize = args->coord_components + 1;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        type_to_glsl_constructor_abi_cxx11_((string *)local_1d8,this,&expected_type);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)local_1d8);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)local_1d8,this,args->dref,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)local_1d8);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        SPIRType::~SPIRType(&expected_type);
        goto LAB_0021cc8c;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      DVar2 = ((ImageType *)(local_1d8._32_8_ + 0xf8))->dim;
      if (DVar2 == Dim2D) {
        to_enclosed_expression_abi_cxx11_((string *)local_1d8,this,args->coord,true);
        pcVar8 = ".xy";
        if (bVar5 != false) {
          pcVar8 = ".xy()";
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,pcVar8);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::~string((string *)local_1d8);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)&expected_type,this,args->dref,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_((string *)local_1d8,this,args->coord,true);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,".z)");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        if (DVar2 != Dim1D) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&expected_type,"Invalid type for textureProj with shadow.",
                     (allocator *)local_1d8);
          CompilerError::CompilerError(this_00,(string *)&expected_type);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_enclosed_expression_abi_cxx11_((string *)local_1d8,this,args->coord,true);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,".x");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::~string((string *)local_1d8);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_((string *)&expected_type,this,args->dref,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_enclosed_expression_abi_cxx11_((string *)local_1d8,this,args->coord,true);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &expected_type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,".y)");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::~string((string *)&expected_type);
      pSVar6 = (SPIRType *)local_1d8;
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)&expected_type,this,args->coord,true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&expected_type);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)&expected_type,this,args->dref,true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      pSVar6 = &expected_type;
    }
    ::std::__cxx11::string::~string((string *)pSVar6);
  }
LAB_0021cc8c:
  if (args->grad_y != 0 || args->grad_x != 0) {
    if ((bVar3 == false) || (bVar5 = should_forward(this,args->grad_x), !bVar5)) {
      bVar3 = false;
    }
    else {
      bVar3 = should_forward(this,args->grad_y);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->grad_x,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->grad_y,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->lod == 0) {
    if ((((args->base).is_fetch == true) &&
        (((ImageType *)(local_1d8._32_8_ + 0xf8))->dim != DimBuffer)) &&
       (((ImageType *)(local_1d8._32_8_ + 0xf8))->ms == false)) {
LAB_0021cdc1:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else if (bVar4) {
    DVar2 = ((ImageType *)(local_1d8._32_8_ + 0xf8))->dim;
    if ((DVar2 == Dim2D) || (DVar2 == DimCube)) goto LAB_0021cdc1;
  }
  else {
    bVar5 = check_explicit_lod_allowed(this,args->lod);
    if (bVar5) {
      if (bVar3 == false) {
        bVar3 = false;
      }
      else {
        bVar3 = should_forward(this,args->lod);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pSVar6 = Compiler::expression_type(&this->super_Compiler,args->lod);
      if ((((args->base).is_fetch == true) &&
          (((ImageType *)(local_1d8._32_8_ + 0xf8))->dim != DimBuffer)) &&
         ((((ImageType *)(local_1d8._32_8_ + 0xf8))->ms == false &&
          (*(int *)&(pSVar6->super_IVariant).field_0xc != 7)))) {
        to_expression_abi_cxx11_((string *)local_1d8,this,args->lod,true);
        join<char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&expected_type,(spirv_cross *)0x30b274,(char (*) [5])local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,
                   (char (*) [2])in_R8);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&expected_type);
        pSVar6 = (SPIRType *)local_1d8;
      }
      else {
        to_expression_abi_cxx11_((string *)&expected_type,this,args->lod,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        pSVar6 = &expected_type;
      }
      ::std::__cxx11::string::~string((string *)pSVar6);
    }
  }
  if (args->coffset == 0) {
    if (args->offset == 0) goto LAB_0021ced2;
    if (bVar3 == false) {
      bVar3 = false;
    }
    else {
      bVar3 = should_forward(this,args->offset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->offset,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    if (bVar3 == false) {
      bVar3 = false;
    }
    else {
      bVar3 = should_forward(this,args->coffset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->coffset,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&expected_type);
LAB_0021ced2:
  if (args->sample != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->sample,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->min_lod != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->min_lod,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->sparse_texel != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->sparse_texel,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->bias != 0) {
    if (bVar3 == false) {
      bVar3 = false;
    }
    else {
      bVar3 = should_forward(this,args->bias);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->bias,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  if (args->component != 0) {
    if (bVar3 == false) {
      bVar3 = false;
    }
    else {
      bVar3 = should_forward(this,args->component);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)&expected_type,this,args->component,true);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&expected_type);
  }
  *p_forward = bVar3;
  ::std::__cxx11::string::~string((string *)&coord_expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_expression(img);

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    image_is_comparison(imgtype, img) && args.lod != 0;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";
			farg_str += coord_expr;
			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			if (check_explicit_lod_allowed(args.lod))
			{
				forward = forward && should_forward(args.lod);
				farg_str += ", ";

				auto &lod_expr_type = expression_type(args.lod);

				// Lod expression for TexelFetch in GLSL must be int, and only int.
				if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms &&
				    lod_expr_type.basetype != SPIRType::Int)
				{
					farg_str += join("int(", to_expression(args.lod), ")");
				}
				else
				{
					farg_str += to_expression(args.lod);
				}
			}
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.coffset)
	{
		forward = forward && should_forward(args.coffset);
		farg_str += ", ";
		farg_str += to_expression(args.coffset);
	}
	else if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += to_expression(args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += to_expression(args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component)
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += to_expression(args.component);
	}

	*p_forward = forward;

	return farg_str;
}